

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUtility.cpp
# Opt level: O3

int __thiscall TestSuit::run(TestSuit *this)

{
  pointer pTVar1;
  ostream *poVar2;
  long *plVar3;
  char *pcVar4;
  pointer pTVar5;
  undefined1 auVar6 [12];
  
  (*this->_vptr_TestSuit[2])();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Number of test cases: ",0x16);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  pTVar5 = (this->tests).super__Vector_base<TestFunction,_std::allocator<TestFunction>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar1 = (this->tests).super__Vector_base<TestFunction,_std::allocator<TestFunction>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (pTVar5 == pTVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"All tests passed.",0x11);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
      std::ostream::put('\b');
      std::ostream::flush();
      return 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Testing ",8);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(pTVar5->name)._M_dataplus._M_p,
                        (pTVar5->name)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if ((pTVar5->func).super__Function_base._M_manager == (_Manager_type)0x0) break;
    (*(pTVar5->func)._M_invoker)((_Any_data *)&pTVar5->func);
    pTVar5 = pTVar5 + 1;
  }
  auVar6 = std::__throw_bad_function_call();
  if (auVar6._8_4_ == 1) {
    plVar3 = (long *)__cxa_begin_catch(auVar6._0_8_);
    (*this->_vptr_TestSuit[3])(this);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"test failed.",0xc);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    pcVar4 = (char *)(**(code **)(*plVar3 + 0x10))(plVar3);
    poVar2 = std::operator<<((ostream *)&std::cerr,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar2);
    __cxa_end_catch();
    return -1;
  }
  _Unwind_Resume(auVar6._0_8_);
}

Assistant:

int TestSuit::run()
{
    setup();
    std::cout << "Number of test cases: " << tests.size() << std::endl;

    for (auto& test : tests)
    {
        std::cout << "Testing " << test.name << std::endl;

        try
        {
            test.func();
        }
        catch (std::exception& e)
        {
            on_failed();
            std::cerr << "test failed." << std::endl;
            std::cerr << e.what() << std::endl;
            return -1;
        }
    }

    std::cout << "All tests passed." << std::endl;
    return 0;
}